

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void wallet::MaybeResendWalletTxs(WalletContext *context)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bool in_stack_00000016;
  bool in_stack_00000017;
  CWallet *in_stack_00000018;
  shared_ptr<wallet::CWallet> *pwallet;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff98;
  CWallet *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  WalletContext *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetWallets(in_stack_ffffffffffffffc0);
  _GLOBAL__N_1::std::
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
  begin((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
         *)in_stack_ffffffffffffffa0);
  _GLOBAL__N_1::std::
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::end
            ((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
              *)in_stack_ffffffffffffffa0);
  while (bVar2 = __gnu_cxx::
                 operator==<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                           ((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                             *)in_stack_ffffffffffffffa0), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                 *)in_stack_ffffffffffffff98);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (in_stack_ffffffffffffff98);
    bVar2 = CWallet::ShouldResend
                      ((CWallet *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    in_stack_ffffffffffffffa8 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffa8);
    if (bVar2) {
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(in_stack_ffffffffffffff98);
      CWallet::ResubmitWalletTransactions(in_stack_00000018,in_stack_00000017,in_stack_00000016);
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(in_stack_ffffffffffffff98);
      CWallet::SetNextResend(in_stack_ffffffffffffffa0);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                  *)in_stack_ffffffffffffff98);
  }
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::~vector((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MaybeResendWalletTxs(WalletContext& context)
{
    for (const std::shared_ptr<CWallet>& pwallet : GetWallets(context)) {
        if (!pwallet->ShouldResend()) continue;
        pwallet->ResubmitWalletTransactions(/*relay=*/true, /*force=*/false);
        pwallet->SetNextResend();
    }
}